

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TAPReporter::testRunStarting(TAPReporter *this,TestRunInfo *param_2)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  long in_RDI;
  TestSpec *in_stack_ffffffffffffffd8;
  
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1ab47a);
  if (bVar1) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x20),"# filters: ");
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x68))();
    poVar3 = Catch::operator<<(poVar3,in_stack_ffffffffffffffd8);
    std::operator<<(poVar3,'\n');
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x20),"# rng-seed: ");
  uVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x88))();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void TAPReporter::testRunStarting( TestRunInfo const& ) {
        if ( m_config->testSpec().hasFilters() ) {
            m_stream << "# filters: " << m_config->testSpec() << '\n';
        }
        m_stream << "# rng-seed: " << m_config->rngSeed() << '\n';
    }